

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O2

void __thiscall
leveldb::TableCache::TableCache(TableCache *this,string *dbname,Options *options,int entries)

{
  long lVar1;
  Cache *pCVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->env_ = options->env;
  std::__cxx11::string::string((string *)&this->dbname_,dbname);
  this->options_ = options;
  pCVar2 = NewLRUCache((long)entries);
  this->cache_ = pCVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TableCache::TableCache(const std::string& dbname, const Options& options,
                       int entries)
    : env_(options.env),
      dbname_(dbname),
      options_(options),
      cache_(NewLRUCache(entries)) {}